

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_surjectionproof_initialize
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,size_t *input_index,
              secp256k1_fixed_asset_tag *fixed_input_tags,size_t n_input_tags,
              size_t n_input_tags_to_use,secp256k1_fixed_asset_tag *fixed_output_tag,
              size_t n_max_iterations,uchar *random_seed32)

{
  secp256k1_fixed_asset_tag *psVar1;
  uchar *puVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  void *pvVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  uchar *puVar12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  secp256k1_surjectionproof_csprng csprng;
  byte bStack_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_a8;
  secp256k1_sha256 local_98;
  
  if (((((proof == (secp256k1_surjectionproof *)0x0) || (input_index == (size_t *)0x0)) ||
       (fixed_input_tags == (secp256k1_fixed_asset_tag *)0x0)) ||
      ((fixed_output_tag == (secp256k1_fixed_asset_tag *)0x0 || (random_seed32 == (uchar *)0x0))))
     || ((0x100 < n_input_tags ||
         ((0x100 < n_input_tags_to_use || (n_input_tags < n_input_tags_to_use)))))) {
    secp256k1_surjectionproof_initialize_cold_1();
    iVar6 = 0;
  }
  else {
    local_c8 = *(undefined8 *)random_seed32;
    uStack_c0 = *(undefined8 *)(random_seed32 + 8);
    local_b8 = *(undefined8 *)(random_seed32 + 0x10);
    uStack_b0 = *(undefined8 *)(random_seed32 + 0x18);
    local_a8 = 0;
    pvVar7 = memset(proof->data,0,0x2020);
    proof->n_inputs = n_input_tags;
    puVar12 = proof->used_inputs;
    uVar11 = 0;
    do {
      proof->used_inputs[0x10] = '\0';
      proof->used_inputs[0x11] = '\0';
      proof->used_inputs[0x12] = '\0';
      proof->used_inputs[0x13] = '\0';
      proof->used_inputs[0x14] = '\0';
      proof->used_inputs[0x15] = '\0';
      proof->used_inputs[0x16] = '\0';
      proof->used_inputs[0x17] = '\0';
      proof->used_inputs[0x18] = '\0';
      proof->used_inputs[0x19] = '\0';
      proof->used_inputs[0x1a] = '\0';
      proof->used_inputs[0x1b] = '\0';
      proof->used_inputs[0x1c] = '\0';
      proof->used_inputs[0x1d] = '\0';
      proof->used_inputs[0x1e] = '\0';
      proof->used_inputs[0x1f] = '\0';
      puVar12[0] = '\0';
      puVar12[1] = '\0';
      puVar12[2] = '\0';
      puVar12[3] = '\0';
      puVar12[4] = '\0';
      puVar12[5] = '\0';
      puVar12[6] = '\0';
      puVar12[7] = '\0';
      puVar12[8] = '\0';
      puVar12[9] = '\0';
      puVar12[10] = '\0';
      puVar12[0xb] = '\0';
      puVar12[0xc] = '\0';
      puVar12[0xd] = '\0';
      puVar12[0xe] = '\0';
      puVar12[0xf] = '\0';
      if (n_input_tags_to_use == 0) {
        bVar5 = true;
      }
      else {
        sVar9 = 0;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = n_input_tags;
        uVar14 = 0x100 - SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x100)) % auVar4,0);
        bVar5 = false;
        uVar10 = n_input_tags_to_use;
        do {
          do {
            do {
              if (local_a8 - 0x1fU < 0xffffffffffffffe0) {
                local_98.s[0] = 0x6a09e667;
                local_98.s[1] = 0xbb67ae85;
                local_98.s[2] = 0x3c6ef372;
                local_98.s[3] = 0xa54ff53a;
                local_98.s[4] = 0x510e527f;
                local_98.s[5] = 0x9b05688c;
                local_98.s[6] = 0x1f83d9ab;
                local_98.s[7] = 0x5be0cd19;
                local_98.bytes = 0;
                secp256k1_sha256_write(&local_98,(uchar *)&local_c8,0x20);
                secp256k1_sha256_finalize(&local_98,(uchar *)&local_c8);
                local_a8 = 0;
              }
              bVar3 = *(byte *)((long)&local_c8 + local_a8);
              local_a8 = local_a8 + 1;
              if (bVar3 < uVar14) {
                uVar10 = (ulong)bVar3 % n_input_tags;
              }
            } while (uVar14 <= bVar3);
            psVar1 = fixed_input_tags + uVar10;
            puVar2 = fixed_input_tags[uVar10].data + 0x10;
            auVar16[0] = -(fixed_output_tag->data[0] == psVar1->data[0]);
            auVar16[1] = -(fixed_output_tag->data[1] == psVar1->data[1]);
            auVar16[2] = -(fixed_output_tag->data[2] == psVar1->data[2]);
            auVar16[3] = -(fixed_output_tag->data[3] == psVar1->data[3]);
            auVar16[4] = -(fixed_output_tag->data[4] == psVar1->data[4]);
            auVar16[5] = -(fixed_output_tag->data[5] == psVar1->data[5]);
            auVar16[6] = -(fixed_output_tag->data[6] == psVar1->data[6]);
            auVar16[7] = -(fixed_output_tag->data[7] == psVar1->data[7]);
            auVar16[8] = -(fixed_output_tag->data[8] == psVar1->data[8]);
            auVar16[9] = -(fixed_output_tag->data[9] == psVar1->data[9]);
            auVar16[10] = -(fixed_output_tag->data[10] == psVar1->data[10]);
            auVar16[0xb] = -(fixed_output_tag->data[0xb] == psVar1->data[0xb]);
            auVar16[0xc] = -(fixed_output_tag->data[0xc] == psVar1->data[0xc]);
            auVar16[0xd] = -(fixed_output_tag->data[0xd] == psVar1->data[0xd]);
            auVar16[0xe] = -(fixed_output_tag->data[0xe] == psVar1->data[0xe]);
            auVar16[0xf] = -(fixed_output_tag->data[0xf] == psVar1->data[0xf]);
            auVar15[0] = -(fixed_output_tag->data[0x10] == *puVar2);
            auVar15[1] = -(fixed_output_tag->data[0x11] == puVar2[1]);
            auVar15[2] = -(fixed_output_tag->data[0x12] == puVar2[2]);
            auVar15[3] = -(fixed_output_tag->data[0x13] == puVar2[3]);
            auVar15[4] = -(fixed_output_tag->data[0x14] == puVar2[4]);
            auVar15[5] = -(fixed_output_tag->data[0x15] == puVar2[5]);
            auVar15[6] = -(fixed_output_tag->data[0x16] == puVar2[6]);
            auVar15[7] = -(fixed_output_tag->data[0x17] == puVar2[7]);
            auVar15[8] = -(fixed_output_tag->data[0x18] == puVar2[8]);
            auVar15[9] = -(fixed_output_tag->data[0x19] == puVar2[9]);
            auVar15[10] = -(fixed_output_tag->data[0x1a] == puVar2[10]);
            auVar15[0xb] = -(fixed_output_tag->data[0x1b] == puVar2[0xb]);
            auVar15[0xc] = -(fixed_output_tag->data[0x1c] == puVar2[0xc]);
            auVar15[0xd] = -(fixed_output_tag->data[0x1d] == puVar2[0xd]);
            auVar15[0xe] = -(fixed_output_tag->data[0x1e] == puVar2[0xe]);
            auVar15[0xf] = -(fixed_output_tag->data[0x1f] == puVar2[0xf]);
            auVar15 = auVar15 & auVar16;
            if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
              *input_index = uVar10;
              bVar5 = true;
            }
            bVar3 = (byte)uVar10;
            uVar8 = uVar10 >> 3;
            uVar13 = (uint)uVar10 & 7;
            uVar10 = (ulong)uVar13;
          } while ((puVar12[uVar8] >> uVar13 & 1) != 0);
          puVar12[uVar8] = (byte)(1 << (bVar3 & 7)) | puVar12[uVar8];
          sVar9 = sVar9 + 1;
          uVar10 = n_input_tags_to_use;
        } while (sVar9 != n_input_tags_to_use);
        bVar5 = !bVar5;
        pvVar7 = (void *)((ulong)pvVar7 & 0xffffffff);
      }
      uVar11 = uVar11 + 1;
      pvVar7 = (void *)((ulong)pvVar7 & 0xffffffff);
      if (n_max_iterations <= uVar11) {
        pvVar7 = (void *)0x0;
      }
      if (!bVar5) {
        pvVar7 = (void *)(uVar11 & 0xffffffff);
      }
      iVar6 = (int)pvVar7;
    } while ((bVar5) && (uVar11 < n_max_iterations));
  }
  return iVar6;
}

Assistant:

int secp256k1_surjectionproof_initialize(const secp256k1_context* ctx, secp256k1_surjectionproof* proof, size_t *input_index, const secp256k1_fixed_asset_tag* fixed_input_tags, const size_t n_input_tags, const size_t n_input_tags_to_use, const secp256k1_fixed_asset_tag* fixed_output_tag, const size_t n_max_iterations, const unsigned char *random_seed32) {
    secp256k1_surjectionproof_csprng csprng;
    size_t n_iterations = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(input_index != NULL);
    ARG_CHECK(fixed_input_tags != NULL);
    ARG_CHECK(fixed_output_tag != NULL);
    ARG_CHECK(random_seed32 != NULL);
    ARG_CHECK(n_input_tags <= SECP256K1_SURJECTIONPROOF_MAX_N_INPUTS);
    ARG_CHECK(n_input_tags_to_use <= SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS);
    ARG_CHECK(n_input_tags_to_use <= n_input_tags);
    (void) ctx;

    secp256k1_surjectionproof_csprng_init(&csprng, random_seed32);
    memset(proof->data, 0, sizeof(proof->data));
    proof->n_inputs = n_input_tags;

    while (1) {
        int has_output_tag = 0;
        size_t i;

        /* obtain a random set of indices */
        memset(proof->used_inputs, 0, sizeof(proof->used_inputs));
        for (i = 0; i < n_input_tags_to_use; i++) {
            while (1) {
                size_t next_input_index;
                next_input_index = secp256k1_surjectionproof_csprng_next(&csprng, n_input_tags);
                if (memcmp(&fixed_input_tags[next_input_index], fixed_output_tag, sizeof(*fixed_output_tag)) == 0) {
                    *input_index = next_input_index;
                    has_output_tag = 1;
                }

                if (!(proof->used_inputs[next_input_index / 8] & (1 << (next_input_index  % 8)))) {
                    proof->used_inputs[next_input_index / 8] |= (1 << (next_input_index % 8));
                    break;
                }
            }
        }

        /* Check if we succeeded */
        n_iterations++;
        if (has_output_tag) {
#ifdef VERIFY
            proof->initialized = 1;
#endif
            return n_iterations;
        }
        if (n_iterations >= n_max_iterations) {
#ifdef VERIFY
            proof->initialized = 0;
#endif
            return 0;
        }
    }
}